

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O0

bool __thiscall Field::valuePossible(Field *this,int i)

{
  size_type sVar1;
  reference local_30;
  int local_20;
  int local_1c;
  int l;
  int i_local;
  Field *this_local;
  
  if ((this->fixed_ & 1U) == 0) {
    local_1c = i;
    _l = this;
    sVar1 = std::vector<bool,_std::allocator<bool>_>::size(&this->valuesPossible_);
    local_20 = (int)sVar1;
    if (local_20 < local_1c) {
      this_local._7_1_ = false;
    }
    else {
      local_30 = std::vector<bool,_std::allocator<bool>_>::at
                           (&this->valuesPossible_,(long)(local_1c + -1));
      this_local._7_1_ = std::_Bit_reference::operator_cast_to_bool(&local_30);
    }
  }
  else {
    this_local._7_1_ = this->value_ == i;
  }
  return this_local._7_1_;
}

Assistant:

bool Field::valuePossible(int i)
{
  if(fixed_)
  {
    return value_ == i;
  }
  int l = valuesPossible_.size();
  if(l < i)
    return false;
  return valuesPossible_.at(i-1);
}